

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_list.c
# Opt level: O3

DsListIter * ds_list_iter_create(DsList *list)

{
  DsListIter *pDVar1;
  DsListEntry *pDVar2;
  
  if (list == (DsList *)0x0) {
    return (DsListIter *)0x0;
  }
  pDVar1 = (DsListIter *)malloc(0x20);
  if (pDVar1 != (DsListIter *)0x0) {
    pDVar2 = (DsListEntry *)malloc(0x18);
    pDVar1->head = pDVar2;
    if (pDVar2 != (DsListEntry *)0x0) {
      pDVar2->data = (void *)0x0;
      pDVar2->prev = (DsListEntry *)0x0;
      pDVar2->next = list->entry;
      pDVar1->curr = pDVar2;
      pDVar1->size = list->size;
      pDVar1->index = -1;
      return pDVar1;
    }
  }
  exit(2);
}

Assistant:

DsListIter *ds_list_iter_create(DsList *list)
{
    if (NULL == list)
        return NULL;
    DsListIter *iter = (DsListIter *)malloc(sizeof(DsListIter));
    if (NULL == iter)
        exit(DS_STATUS_OUTMEM);
    iter->head = (DsListEntry *)malloc(sizeof(DsListEntry));
    if (NULL == iter->head)
        exit(DS_STATUS_OUTMEM);
    iter->head->data = NULL;
    iter->head->prev = NULL;
    iter->head->next = list->entry;
    iter->curr = iter->head;
    iter->size = list->size;
    iter->index = -1;
    return iter;
}